

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManPrintCo(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  
  uVar1 = (uint)*(undefined8 *)pObj;
  if (((int)uVar1 < 0) && ((uVar1 & 0x1fffffff) != 0x1fffffff)) {
    printf("TFI cone of CO number %d:\n",
           (ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff));
    Gia_ManPrintCo_rec(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
    Gia_ObjPrint(p,pObj);
    return;
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x59e,"void Gia_ManPrintCo(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManPrintCo( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsCo(pObj) );
    printf( "TFI cone of CO number %d:\n", Gia_ObjCioId(pObj) );
    Gia_ManPrintCo_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ObjPrint( p, pObj );
}